

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

optional<int> __thiscall Instructions::defineName(Instructions *this,string *name,int line)

{
  optional<int> oVar1;
  size_t in_RCX;
  ulong uVar2;
  ulong uVar3;
  
  oVar1 = findName(this,name);
  if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    uVar2 = 0x100000000;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->names,name);
    uVar3 = ((long)(this->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    write(this,8,(void *)(ulong)(uint)line,in_RCX);
    write(this,(uint)uVar3 & 0xff,(void *)(ulong)(uint)line,in_RCX);
    uVar3 = uVar3 & 0xffffffff;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
  }
  return (optional<int>)(uVar3 | uVar2);
}

Assistant:

std::optional<int> Instructions::defineName(const std::string& name, int line)
{
    if (findName(name).has_value())
    {
        return {};
    }
    else
    {
        names.push_back(name);
        auto result = names.size() - 1;
        write(OpCode::DEFINE_NAME, line);
        write(result, line);
        return result;
    }
}